

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_err_msg(lysp_yin_ctx *ctx,void *parent,char **value,lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  yin_subelement subelems [2];
  yin_subelement local_48;
  undefined4 local_30;
  char **local_28;
  undefined2 local_20;
  
  local_48.dest = (void *)0x0;
  local_48.flags = 0;
  local_48._18_6_ = 0;
  local_48.type = LY_STMT_EXTENSION_INSTANCE;
  local_48._4_4_ = 0;
  local_30 = 0x350005;
  local_20 = 7;
  local_28 = value;
  LVar1 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar1 == LY_SUCCESS) {
    LVar1 = yin_parse_attribute(ctx,YIN_ARG_NONE,(char **)0x0,Y_MAYBE_STR_ARG,LY_STMT_ERROR_MESSAGE)
    ;
    if (LVar1 == LY_SUCCESS) {
      LVar1 = yin_parse_content(ctx,&local_48,2,parent,LY_STMT_ERROR_MESSAGE,(char **)0x0,exts);
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
yin_parse_err_msg(struct lysp_yin_ctx *ctx, const void *parent, const char **value, struct lysp_ext_instance **exts)
{
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        {LY_STMT_ARG_VALUE, value, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE | YIN_SUBELEM_FIRST}
    };

    /* check attributes */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NONE, NULL, Y_MAYBE_STR_ARG, LY_STMT_ERROR_MESSAGE));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_ERROR_MESSAGE, NULL, exts));

    return LY_SUCCESS;
}